

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

string * __thiscall
google::protobuf::Message::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar3) + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)(lVar1 + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,*(long *)(lVar1 + 0x28) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::GetTypeName() const {
  return GetDescriptor()->full_name();
}